

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::predict
          (Model *this,vector<int,_std::allocator<int>_> *input,int32_t k,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden,Vector *output)

{
  element_type *peVar1;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  in_RCX;
  int in_EDX;
  Model *in_RSI;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_RDI;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  in_R8;
  _func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *in_R9;
  Vector *unaff_retaddr;
  Vector *in_stack_00000008;
  Vector *in_stack_00000010;
  undefined4 in_stack_00000030;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (0 < in_EDX) {
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::reserve
              ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)in_RSI,
               CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    computeHidden(in_RSI,(vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(Vector *)in_RCX._M_current);
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x161dd6);
    if (peVar1->loss == hs) {
      dfs((Model *)CONCAT44(k,in_stack_00000030),heap._4_4_,(int32_t)heap,hidden._4_4_,
          (vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)output,
          in_stack_00000010);
    }
    else {
      findKBest((Model *)hidden,output._4_4_,
                (vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                in_stack_00000010,in_stack_00000008,unaff_retaddr);
    }
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin(in_RDI);
    std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end(in_RDI);
    std::
    sort_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
              (in_RCX,in_R8,in_R9);
    return;
  }
  __assert_fail("k > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/model.cc"
                ,0x7b,
                "void fasttext::Model::predict(const std::vector<int32_t> &, int32_t, std::vector<std::pair<real, int32_t>> &, Vector &, Vector &) const"
               );
}

Assistant:

void Model::predict(const std::vector<int32_t>& input, int32_t k,
                    std::vector<std::pair<real, int32_t>>& heap,
                    Vector& hidden, Vector& output) const {
  assert(k > 0);
  heap.reserve(k + 1);
  computeHidden(input, hidden);
  if (args_->loss == loss_name::hs) {
    dfs(k, 2 * osz_ - 2, 0.0, heap, hidden);
  } else {
    findKBest(k, heap, hidden, output);
  }
  std::sort_heap(heap.begin(), heap.end(), comparePairs);
}